

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_mload(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  MOB_INDEX_DATA *pMobIndex;
  CHAR_DATA *ch_00;
  char *txt;
  char arg [4608];
  char buf [4608];
  
  one_argument(argument,arg);
  txt = "Syntax: load mob <vnum>.\n\r";
  if (arg[0] != '\0') {
    bVar1 = is_number(arg);
    if (bVar1) {
      iVar2 = atoi(arg);
      pMobIndex = get_mob_index(iVar2);
      if (pMobIndex == (MOB_INDEX_DATA *)0x0) {
        txt = "No mob has that vnum.\n\r";
      }
      else {
        ch_00 = create_mobile(pMobIndex);
        char_to_room(ch_00,ch->in_room);
        act("$n has created $N!",ch,(void *)0x0,ch_00,(uint)(0x32 < ch->invis_level) * 5);
        sprintf(buf,"$N loads %s.",ch_00->short_descr);
        iVar2 = get_trust(ch);
        wiznet(buf,ch,(OBJ_DATA *)0x0,0x10,0xc,iVar2);
        txt = "Ok.\n\r";
      }
    }
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_mload(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	MOB_INDEX_DATA *pMobIndex;
	CHAR_DATA *victim;
	char buf[MAX_STRING_LENGTH];

	one_argument(argument, arg);

	if (arg[0] == '\0' || !is_number(arg))
	{
		send_to_char("Syntax: load mob <vnum>.\n\r", ch);
		return;
	}

	pMobIndex = get_mob_index(atoi(arg));

	if (pMobIndex == nullptr)
	{
		send_to_char("No mob has that vnum.\n\r", ch);
		return;
	}

	victim = create_mobile(pMobIndex);

	char_to_room(victim, ch->in_room);

	act("$n has created $N!", ch, nullptr, victim, ch->invis_level > 50 ? TO_IMMINROOM : TO_ROOM);

	sprintf(buf, "$N loads %s.", victim->short_descr);
	wiznet(buf, ch, nullptr, WIZ_LOAD, WIZ_SECURE, get_trust(ch));

	send_to_char("Ok.\n\r", ch);
}